

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitError<View> * __thiscall
Fixpp::visitTagView<Fixpp::TagT<372u,Fixpp::Type::String>>
          (VisitError<View> *__return_storage_ptr__,Fixpp *this,char *frame,size_t size)

{
  undefined1 local_110 [8];
  anon_class_16_2_24bb6e64 doVisitTag;
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> context;
  StreamCursor local_68;
  StreamCursor cursor;
  RawStreamBuf<char> streambuf;
  size_t size_local;
  char *frame_local;
  
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)&cursor,(char *)this,(size_t)frame);
  StreamCursor::StreamCursor(&local_68,(StreamBuf<char> *)&cursor,0);
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_>::TypedParsingContext
            ((TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> *)&doVisitTag.context,
             &local_68);
  local_110 = (undefined1  [8])&local_68;
  doVisitTag.cursor = (StreamCursor *)&doVisitTag.context;
  visitTagView<Fixpp::TagT<372U,_Fixpp::Type::String>_>::anon_class_16_2_24bb6e64::operator()
            ((anon_class_16_2_24bb6e64 *)local_110);
  TypedParsingContext<std::pair<const_char_*,_unsigned_long>_>::toVisitError
            (__return_storage_ptr__,
             (TypedParsingContext<std::pair<const_char_*,_unsigned_long>_> *)&doVisitTag.context);
  RawStreamBuf<char>::~RawStreamBuf((RawStreamBuf<char> *)&cursor);
  return __return_storage_ptr__;
}

Assistant:

VisitError<View> visitTagView(const char* frame, size_t size)
    {
        RawStreamBuf<> streambuf(const_cast<char *>(frame), size);
        StreamCursor cursor(&streambuf);

        TypedParsingContext<View> context(cursor);

        auto doVisitTag = [&]() {
            do
            {
                int tag;
                TRY_MATCH_INT(
                    tag,
                    "Encountered invalid tag, expected int, got '%c'",
                    CURSOR_CURRENT(cursor)
                );
                TRY_ADVANCE("Expected value after tag %d, got EOF", tag);

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                if (tag == Tag::Id)
                {
                    context.setValue(valueToken.view());
                    return;
                }

                cursor.advance(1);

            } while (!cursor.eof() && !context.hasError());

            context.setError(ErrorKind::UnknownTag, "Could not find tag %d in given frame", Tag::Id);
        };

        doVisitTag();

        return context.toVisitError();
    }